

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O3

double __thiscall
icu_63::DayPeriodRules::getMidPointForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  int32_t iVar1;
  int32_t iVar2;
  double dVar3;
  
  dVar3 = -1.0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = getStartHourForDayPeriod(this,dayPeriod,errorCode);
    iVar2 = getEndHourForDayPeriod(this,dayPeriod,errorCode);
    dVar3 = -1.0;
    if (((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
        (dVar3 = (double)(iVar2 + iVar1) * 0.5, iVar2 < iVar1)) &&
       (dVar3 = dVar3 + 12.0, 24.0 <= dVar3)) {
      dVar3 = dVar3 + -24.0;
    }
  }
  return dVar3;
}

Assistant:

double DayPeriodRules::getMidPointForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    int32_t startHour = getStartHourForDayPeriod(dayPeriod, errorCode);
    int32_t endHour = getEndHourForDayPeriod(dayPeriod, errorCode);
    // Can't obtain startHour or endHour; bail out.
    if (U_FAILURE(errorCode)) { return -1; }

    double midPoint = (startHour + endHour) / 2.0;

    if (startHour > endHour) {
        // dayPeriod wraps around midnight. Shift midPoint by 12 hours, in the direction that
        // lands it in [0, 24).
        midPoint += 12;
        if (midPoint >= 24) {
            midPoint -= 24;
        }
    }

    return midPoint;
}